

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O0

void nn_btcp_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_atcp *pnVar1;
  nn_list_item *it;
  nn_btcp *local_38;
  nn_atcp *atcp;
  nn_btcp *btcp;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_38 = (nn_btcp *)self;
  if (self == (nn_fsm *)0x0) {
    local_38 = (nn_btcp *)0x0;
  }
  switch(local_38->state) {
  case 1:
    if (src != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
              ,0x12d);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)local_38->state,0xfffffffe,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
              ,0x129);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_btcp_start_listening(local_38);
    break;
  case 2:
    if ((nn_atcp *)srcptr == local_38->atcp) {
      if (type != 0x85b7) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
                ,0x145);
        fflush(_stderr);
        nn_err_abort();
      }
      pnVar1 = local_38->atcp;
      it = nn_list_end(&local_38->atcps);
      nn_list_insert(&local_38->atcps,&pnVar1->item,it);
      local_38->atcp = (nn_atcp *)0x0;
      nn_btcp_start_accepting(local_38);
    }
    else {
      if (src != 2) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","src == NN_BTCP_SRC_ATCP",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
                ,0x14b);
        fflush(_stderr);
        nn_err_abort();
      }
      if (type == 0x85b8) {
        nn_atcp_stop((nn_atcp *)srcptr);
      }
      else {
        if (type != 0x85b9) {
          fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                  (ulong)(uint)local_38->state,2,(ulong)(uint)type,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
                  ,0x157);
          fflush(_stderr);
          nn_err_abort();
        }
        nn_list_erase(&local_38->atcps,(nn_list_item *)((long)srcptr + 0x730));
        nn_atcp_term((nn_atcp *)srcptr);
        nn_free(srcptr);
      }
    }
    break;
  default:
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
            ,0x19f);
    fflush(_stderr);
    nn_err_abort();
  case 7:
    if (src != 3) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
              ,0x184);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != 1) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)local_38->state,3,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
              ,0x180);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_backoff_stop(&local_38->retry);
    local_38->state = 9;
    break;
  case 8:
    if (src != 1) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
              ,0x16e);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type == 7) {
      nn_backoff_start(&local_38->retry);
      local_38->state = 7;
    }
    else if (type != 8) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)local_38->state,1,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
              ,0x16a);
      fflush(_stderr);
      nn_err_abort();
    }
    break;
  case 9:
    if (src != 3) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
              ,0x198);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != 2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)local_38->state,3,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/btcp.c"
              ,0x194);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_btcp_start_listening(local_38);
  }
  return;
}

Assistant:

static void nn_btcp_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_btcp *btcp;
    struct nn_atcp *atcp;

    btcp = nn_cont (self, struct nn_btcp, fsm);

    switch (btcp->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BTCP_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_btcp_start_listening (btcp);
                return;
            default:
                nn_fsm_bad_action (btcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (btcp->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  The execution is yielded to the atcp state machine in this state.         */
/******************************************************************************/
    case NN_BTCP_STATE_ACTIVE:
        if (srcptr == btcp->atcp) {
            switch (type) {
            case NN_ATCP_ACCEPTED:

                /*  Move the newly created connection to the list of existing
                    connections. */
                nn_list_insert (&btcp->atcps, &btcp->atcp->item,
                    nn_list_end (&btcp->atcps));
                btcp->atcp = NULL;

                /*  Start waiting for a new incoming connection. */
                nn_btcp_start_accepting (btcp);

                return;

            default:
                nn_fsm_bad_action (btcp->state, src, type);
            }
        }

        /*  For all remaining events we'll assume they are coming from one
            of remaining child atcp objects. */
        nn_assert (src == NN_BTCP_SRC_ATCP);
        atcp = (struct nn_atcp*) srcptr;
        switch (type) {
        case NN_ATCP_ERROR:
            nn_atcp_stop (atcp);
            return;
        case NN_ATCP_STOPPED:
            nn_list_erase (&btcp->atcps, &atcp->item);
            nn_atcp_term (atcp);
            nn_free (atcp);
            return;
        default:
            nn_fsm_bad_action (btcp->state, src, type);
        }

/******************************************************************************/
/*  CLOSING_USOCK state.                                                     */
/*  usock object was asked to stop but it haven't stopped yet.                */
/******************************************************************************/
    case NN_BTCP_STATE_CLOSING:
        switch (src) {

        case NN_BTCP_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_backoff_start (&btcp->retry);
                btcp->state = NN_BTCP_STATE_WAITING;
                return;
            default:
                nn_fsm_bad_action (btcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (btcp->state, src, type);
        }

/******************************************************************************/
/*  WAITING state.                                                            */
/*  Waiting before re-bind is attempted. This way we won't overload           */
/*  the system by continuous re-bind attemps.                                 */
/******************************************************************************/
    case NN_BTCP_STATE_WAITING:
        switch (src) {

        case NN_BTCP_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_TIMEOUT:
                nn_backoff_stop (&btcp->retry);
                btcp->state = NN_BTCP_STATE_STOPPING_BACKOFF;
                return;
            default:
                nn_fsm_bad_action (btcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (btcp->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_BACKOFF state.                                                   */
/*  backoff object was asked to stop, but it haven't stopped yet.             */
/******************************************************************************/
    case NN_BTCP_STATE_STOPPING_BACKOFF:
        switch (src) {

        case NN_BTCP_SRC_RECONNECT_TIMER:
            switch (type) {
            case NN_BACKOFF_STOPPED:
                nn_btcp_start_listening (btcp);
                return;
            default:
                nn_fsm_bad_action (btcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (btcp->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (btcp->state, src, type);
    }
}